

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_gramma_analysis.cpp
# Opt level: O2

compile_errcode __thiscall VariableDefinition::Parse(VariableDefinition *this)

{
  LogTools *log_tools_ptr;
  SymbolName SVar1;
  undefined4 uVar2;
  char *pcVar3;
  string *error_content;
  allocator local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar2 = 0;
  do {
    SVar1 = SymbolQueue::GetCurrentName(handle_symbol_queue);
    log_tools_ptr = g_log_tools;
    switch(uVar2) {
    case 0:
      uVar2 = 1;
      if ((SVar1 & ~SWITCH_SYM) != INT_SYM) {
        return -1;
      }
      break;
    case 1:
      uVar2 = 2;
      if (SVar1 != IDENTIFIER_SYM) {
        std::__cxx11::string::string((string *)&local_70,symbol_name_string[SVar1],&local_71);
        std::operator+(&local_50,"expected a valid identifier, but get a ",&local_70);
        GrammaErrorLogs(log_tools_ptr,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        error_content = &local_70;
LAB_00135852:
        std::__cxx11::string::~string((string *)error_content);
        return -1;
      }
      break;
    case 2:
      uVar2 = 0xb;
      if (SVar1 != L_SQUARE_BRACKET_SYM) {
        if (SVar1 == SEMICOLON_SYM) goto LAB_0013579f;
        if (SVar1 != COMMA_SYM) {
          pcVar3 = "expected a \'[\' or \',\' or \';\'";
          goto LAB_00135880;
        }
        uVar2 = 1;
      }
      break;
    case 3:
      return 0;
    case 0xb:
      uVar2 = 0xc;
      if (SVar1 != INTERGER_SYM) {
        error_content = &local_50;
        std::__cxx11::string::string
                  ((string *)error_content,"expected a valid identifier",(allocator *)&local_70);
        GrammaErrorLogs(log_tools_ptr,error_content);
        goto LAB_00135852;
      }
      break;
    case 0xc:
      uVar2 = 0xd;
      if (SVar1 != R_SQUARE_BRACKET_SYM) {
        pcVar3 = "expected a \']\'";
LAB_00135880:
        std::__cxx11::string::string((string *)&local_50,pcVar3,(allocator *)&local_70);
        GrammaErrorLogs(log_tools_ptr,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        return 0;
      }
      break;
    case 0xd:
      uVar2 = 1;
      if (SVar1 != COMMA_SYM) {
        if (SVar1 != SEMICOLON_SYM) {
          pcVar3 = "expected a \',\' or \';\'";
          goto LAB_00135880;
        }
LAB_0013579f:
        uVar2 = 3;
      }
    }
    SymbolQueue::NextSymbol(handle_symbol_queue);
  } while( true );
}

Assistant:

compile_errcode VariableDefinition::Parse() {
    int state = 0;
    while (true) {
        SymbolName name = handle_symbol_queue->GetCurrentName();
        switch (state) {
            case 0: {
                if (IsValidVariableType(name)) {
                    state = 1;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 1: {
                if (name == IDENTIFIER_SYM) {
                    state = 2;
                    break;
                } else {
                    GrammaErrorLogs(g_log_tools, "expected a valid identifier, but get a " + string(symbol_name_string[name]));
                    return NOT_MATCH;
                }
            }
            case 2: {
                if (name == L_SQUARE_BRACKET_SYM) {
                    state = 11;
                    break;
                } else if (name == COMMA_SYM) {
                    state = 1;
                    break;
                } else if (name == SEMICOLON_SYM) {
                    state = 3;
                    break;
                } else {
                    GrammaErrorLogs(g_log_tools, "expected a '[' or ',' or ';'");
                    //return NOT_MATCH;
                    // return NOT_MATCH;  // fault-tolerant
                    return COMPILE_OK;
                }
            }
            case 3: return COMPILE_OK;
            case 11: {
                if (name == INTERGER_SYM) {
                    state = 12;
                    break;
                } else {
                    GrammaErrorLogs(g_log_tools, "expected a valid identifier");
                    return NOT_MATCH;
                }
            }
            case 12: {
                if (name == R_SQUARE_BRACKET_SYM) {
                    state = 13;
                    break;
                } else {
                    GrammaErrorLogs(g_log_tools, "expected a ']'");
                    // return NOT_MATCH;  // fault-tolerant
                    return COMPILE_OK;
                }
            }
            case 13: {
                if (name == COMMA_SYM) {
                    state = 1;
                    break;
                } else if (name == SEMICOLON_SYM) {
                    state = 3;
                    break;
                } else {
                    GrammaErrorLogs(g_log_tools, "expected a ',' or ';'");
                    // return NOT_MATCH;  // fault-tolerant
                    return COMPILE_OK;
                }
            }
        }
        handle_symbol_queue->NextSymbol();
    }
}